

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecCall(Parser *this)

{
  bool bVar1;
  size_type sVar2;
  ParseError *__return_storage_ptr__;
  Parser *in_RSI;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> local_1a8;
  undefined1 local_1a0 [8];
  Token name;
  string local_168;
  undefined1 local_148 [8];
  Token dot;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  Token paren;
  string local_70;
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
  args;
  Parser *this_local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *expr;
  
  parsePrecPrimary(this);
  while( true ) {
    while (bVar1 = consume(in_RSI,LEFT_PAREN), !bVar1) {
      bVar1 = consume(in_RSI,DOT);
      if (!bVar1) {
        return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
               (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
      }
      Token::Token((Token *)local_148,&in_RSI->m_previous);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,"Expected property name after \'.\'.",
                 (allocator<char> *)&name.field_0x2f);
      expect(in_RSI,IDENTIFIER,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator((allocator<char> *)&name.field_0x2f);
      Token::Token((Token *)local_1a0,&in_RSI->m_previous);
      std::
      make_unique<enact::FieldExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,enact::Token,enact::Token>
                (&local_1a8,(Token *)this,(Token *)local_1a0);
      std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::operator=
                ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,
                 (unique_ptr<enact::FieldExpr,_std::default_delete<enact::FieldExpr>_> *)&local_1a8)
      ;
      std::unique_ptr<enact::FieldExpr,_std::default_delete<enact::FieldExpr>_>::~unique_ptr
                ((unique_ptr<enact::FieldExpr,_std::default_delete<enact::FieldExpr>_> *)&local_1a8)
      ;
      Token::~Token((Token *)local_1a0);
      Token::~Token((Token *)local_148);
    }
    std::
    vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ::vector((vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
              *)local_48);
    bVar1 = check(in_RSI,RIGHT_PAREN);
    if (!bVar1) {
      do {
        parseExpr((Parser *)local_50);
        std::
        vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
        ::push_back((vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                     *)local_48,(value_type *)local_50);
        std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr
                  ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_50);
        bVar1 = consume(in_RSI,COMMA);
      } while (bVar1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Expected \')\' after function call arguments.",
               (allocator<char> *)&paren.field_0x2f);
    expect(in_RSI,RIGHT_PAREN,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&paren.field_0x2f);
    Token::Token((Token *)local_a8,&in_RSI->m_previous);
    sVar2 = std::
            vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
            ::size((vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                    *)local_48);
    if (0xff < sVar2) break;
    std::
    make_unique<enact::CallExpr,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>,enact::Token>
              ((unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)&dot.line,
               (vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                *)this,(Token *)local_48);
    std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>::operator=
              ((unique_ptr<enact::Expr,std::default_delete<enact::Expr>> *)this,
               (unique_ptr<enact::CallExpr,_std::default_delete<enact::CallExpr>_> *)&dot.line);
    std::unique_ptr<enact::CallExpr,_std::default_delete<enact::CallExpr>_>::~unique_ptr
              ((unique_ptr<enact::CallExpr,_std::default_delete<enact::CallExpr>_> *)&dot.line);
    Token::~Token((Token *)local_a8);
    std::
    vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
    ::~vector((vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
               *)local_48);
  }
  __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
  sVar2 = std::
          vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
          ::size((vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                  *)local_48);
  std::__cxx11::to_string(&local_108,sVar2);
  std::operator+(&local_e8,"Too many arguments in function call; ",&local_108);
  std::operator+(&local_c8,&local_e8," were provided, max is 255.");
  errorAt(__return_storage_ptr__,in_RSI,(Token *)local_a8,&local_c8);
  __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,ParseError::~ParseError);
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecCall() {
        std::unique_ptr<Expr> expr = parsePrecPrimary();

        while (true) {
            if (consume(TokenType::LEFT_PAREN)) {
                std::vector<std::unique_ptr<Expr>> args;
                if (!check(TokenType::RIGHT_PAREN)) {
                    do {
                        args.push_back(parseExpr());
                    } while (consume(TokenType::COMMA));
                }

                expect(TokenType::RIGHT_PAREN, "Expected ')' after function call arguments.");
                Token paren = m_previous;

                if (args.size() > 255) {
                    throw errorAt(paren,
                            "Too many arguments in function call; " +
                            std::to_string(args.size()) +
                            " were provided, max is 255.");
                }

                expr = std::make_unique<CallExpr>(std::move(expr), std::move(args), std::move(paren));
            } else if (consume(TokenType::DOT)) {
                Token dot = m_previous;

                expect(TokenType::IDENTIFIER, "Expected property name after '.'.");
                Token name = m_previous;

                expr = std::make_unique<FieldExpr>(std::move(expr), std::move(name), std::move(dot));
            } else {
                break;
            }
        }

        return expr;
    }